

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_s.hpp
# Opt level: O0

size_type __thiscall
estl::vector_s<unsigned_long,4ul>::check_range<unsigned_long_const*>
          (vector_s<unsigned_long,4ul> *this,unsigned_long *first,unsigned_long *last)

{
  ulong uVar1;
  out_of_range *this_00;
  size_type sVar2;
  range_error *this_01;
  size_type diff;
  int64_t diff_signed;
  unsigned_long *last_local;
  unsigned_long *first_local;
  vector_s<unsigned_long,_4UL> *this_local;
  
  uVar1 = (long)last - (long)first >> 3;
  if ((long)uVar1 < 0) {
    this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
    std::out_of_range::out_of_range
              (this_00,"cas::vector_s range constructing/assigning from inverted range.");
    __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
  }
  sVar2 = vector_s<unsigned_long,_4UL>::capacity((vector_s<unsigned_long,_4UL> *)this);
  if (sVar2 < uVar1) {
    this_01 = (range_error *)__cxa_allocate_exception(0x10);
    std::range_error::range_error(this_01,"cas::vector_s constructing/assigning beyond capacity.");
    __cxa_throw(this_01,&std::range_error::typeinfo,std::range_error::~range_error);
  }
  return uVar1;
}

Assistant:

size_type check_range(InputIt first, InputIt last)
    {
        const std::int64_t diff_signed = last - first;
        if (diff_signed < 0) {
            ESTL_THROW (std::out_of_range, "cas::vector_s range constructing/assigning from inverted range.");
            return 0;
        }
        const size_type diff = static_cast<size_type>(diff_signed);
        if (diff > capacity()) {
            ESTL_THROW (std::range_error, "cas::vector_s constructing/assigning beyond capacity.");
            return 0;
        }
        return diff;
    }